

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O0

void __thiscall cnn::SimpleRNNBuilder::~SimpleRNNBuilder(SimpleRNNBuilder *this)

{
  undefined8 *in_RDI;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *unaff_retaddr;
  
  *in_RDI = &PTR__SimpleRNNBuilder_005f7878;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector(unaff_retaddr)
  ;
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ::~vector((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
             *)unaff_retaddr);
  RNNBuilder::~RNNBuilder((RNNBuilder *)0x50f32e);
  return;
}

Assistant:

SimpleRNNBuilder() = default;